

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O3

void deflate_make_huffman_code
               (uint num_syms,uint max_codeword_len,u32 *freqs,u8 *lens,u32 *codewords)

{
  uint *puVar1;
  byte bVar2;
  u8 uVar3;
  u8 uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uint len_counts [16];
  int local_4f8 [16];
  uint local_4b8 [290];
  
  uVar19 = (ulong)num_syms;
  memset(local_4b8,0,uVar19 * 4);
  if (num_syms == 0) {
    uVar15 = 0;
    uVar10 = 0xffffffff;
  }
  else {
    uVar6 = num_syms - 1;
    uVar10 = 0;
    do {
      uVar15 = freqs[uVar10];
      if (uVar6 <= freqs[uVar10]) {
        uVar15 = uVar6;
      }
      local_4b8[uVar15] = local_4b8[uVar15] + 1;
      uVar10 = uVar10 + 1;
    } while (uVar19 != uVar10);
    uVar15 = 0;
    if (num_syms != 1) {
      uVar10 = 1;
      uVar11 = 0;
      do {
        uVar15 = local_4b8[uVar10] + uVar11;
        local_4b8[uVar10] = uVar11;
        uVar10 = uVar10 + 1;
        uVar11 = uVar15;
      } while (uVar19 != uVar10);
    }
    uVar10 = 0;
    do {
      uVar11 = freqs[uVar10];
      if (uVar11 == 0) {
        lens[uVar10] = '\0';
      }
      else {
        uVar7 = uVar11;
        if (uVar6 <= uVar11) {
          uVar7 = uVar6;
        }
        uVar17 = local_4b8[uVar7];
        local_4b8[uVar7] = uVar17 + 1;
        codewords[uVar17] = (uint)uVar10 | uVar11 << 10;
      }
      uVar10 = uVar10 + 1;
    } while (uVar19 != uVar10);
    uVar10 = (ulong)uVar6;
  }
  uVar6 = local_4b8[uVar10] - local_4b8[num_syms - 2];
  if (1 < uVar6) {
    puVar1 = codewords + local_4b8[num_syms - 2];
    uVar11 = uVar6 >> 1;
    do {
      uVar7 = puVar1[(ulong)uVar11 - 1];
      uVar17 = uVar11 * 2;
      uVar10 = (ulong)uVar11;
      if (uVar17 <= uVar6) {
        uVar10 = (ulong)uVar11;
        do {
          if ((uVar6 <= uVar17) ||
             (uVar14 = (ulong)(uVar17 | 1),
             puVar1[(ulong)(uVar17 | 1) - 1] <= puVar1[(ulong)uVar17 - 1])) {
            uVar14 = (ulong)uVar17;
          }
          if (puVar1[uVar14 - 1] <= uVar7) break;
          puVar1[uVar10 - 1] = puVar1[uVar14 - 1];
          uVar17 = (int)uVar14 * 2;
          uVar10 = uVar14;
        } while (uVar17 <= uVar6);
      }
      puVar1[uVar10 - 1] = uVar7;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    uVar10 = (ulong)uVar6;
    do {
      uVar6 = puVar1[uVar10 - 1];
      puVar1[uVar10 - 1] = *puVar1;
      *puVar1 = uVar6;
      if (uVar10 == 2) break;
      uVar10 = uVar10 - 1;
      uVar14 = 2;
      uVar11 = 1;
      do {
        uVar7 = (uint)uVar10;
        if ((uVar7 <= (uint)uVar14) ||
           (uVar12 = (ulong)((uint)uVar14 | 1), puVar1[uVar12 - 1] <= puVar1[uVar14 - 1])) {
          uVar12 = uVar14;
        }
        uVar16 = (ulong)uVar11;
        if (puVar1[uVar12 - 1] <= uVar6) break;
        puVar1[(ulong)uVar11 - 1] = puVar1[uVar12 - 1];
        uVar17 = (uint)uVar12 * 2;
        uVar14 = (ulong)uVar17;
        uVar16 = uVar12;
        uVar11 = (uint)uVar12;
      } while (uVar17 <= uVar7);
      puVar1[uVar16 - 1] = uVar6;
    } while (1 < uVar7);
  }
  if (uVar15 < 2) {
    deflate_make_huffman_code_cold_1();
  }
  else {
    uVar7 = uVar15 - 1;
    iVar9 = 0;
    uVar10 = 0;
    uVar6 = 0;
    uVar11 = 0;
    do {
      uVar17 = uVar6 + 1;
      if (uVar7 < uVar17) {
LAB_00106b3b:
        if (uVar10 < uVar11 + 2) {
          uVar13 = codewords[uVar6] & 0xfffffc00;
        }
        else {
          uVar18 = codewords[uVar11 + 1] & 0xfffffc00;
          if ((uVar7 < uVar6) || (uVar13 = codewords[uVar6] & 0xfffffc00, uVar18 < uVar13)) {
            uVar13 = uVar18 + (codewords[uVar11] & 0xfffffc00);
            codewords[uVar11] = (codewords[uVar11] & 0x3ff) + iVar9;
            codewords[uVar11 + 1] = (codewords[uVar11 + 1] & 0x3ff) + iVar9;
            uVar11 = uVar11 + 2;
            goto LAB_00106c13;
          }
        }
        uVar13 = (codewords[uVar11] & 0xfffffc00) + uVar13;
        codewords[uVar11] = (codewords[uVar11] & 0x3ff) + iVar9;
        uVar6 = uVar17;
        uVar11 = uVar11 + 1;
      }
      else {
        if ((uVar10 != uVar11) &&
           ((codewords[uVar11] & 0xfffffc00) < (codewords[uVar17] & 0xfffffc00))) goto LAB_00106b3b;
        uVar13 = (codewords[uVar6] & 0xfffffc00) + (codewords[uVar17] & 0xfffffc00);
        uVar6 = uVar6 + 2;
      }
LAB_00106c13:
      codewords[uVar10] = codewords[uVar10] & 0x3ff | uVar13;
      uVar10 = uVar10 + 1;
      iVar9 = iVar9 + 0x400;
    } while (uVar7 != uVar10);
    uVar10 = (ulong)max_codeword_len;
    memset(local_4f8,0,uVar10 * 4 + 4);
    local_4f8[1] = 2;
    codewords[uVar15 - 2] = codewords[uVar15 - 2] & 0x3ff;
    if (-1 < (int)(uVar15 - 3)) {
      uVar14 = (ulong)(uVar15 - 3);
      do {
        uVar6 = codewords[codewords[uVar14] >> 10] >> 10;
        uVar12 = (ulong)uVar6 + 1;
        codewords[uVar14] = (uint)uVar12 << 10 | codewords[uVar14] & 0x3ff;
        uVar15 = max_codeword_len + 1;
        if ((uint)uVar12 < max_codeword_len) {
          iVar9 = local_4f8[(ulong)uVar6 + 1];
          uVar15 = uVar6 + 2;
        }
        else {
          do {
            uVar12 = (ulong)(uVar15 - 2);
            iVar9 = local_4f8[uVar12];
            uVar15 = uVar15 - 1;
          } while (iVar9 == 0);
        }
        local_4f8[uVar12] = iVar9 + -1;
        local_4f8[uVar15] = local_4f8[uVar15] + 2;
        bVar5 = 0 < (long)uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar5);
    }
    if (max_codeword_len == 0) {
      local_4b8[0] = 0;
      local_4b8[1] = 0;
    }
    else {
      uVar14 = 0;
      do {
        for (iVar9 = local_4f8[uVar10]; iVar9 != 0; iVar9 = iVar9 + -1) {
          lens[codewords[uVar14] & 0x3ff] = (u8)uVar10;
          uVar14 = (ulong)((int)uVar14 + 1);
        }
        uVar10 = uVar10 - 1;
      } while ((int)uVar10 != 0);
      local_4b8[0] = 0;
      local_4b8[1] = 0;
      if (max_codeword_len != 1) {
        lVar8 = 0;
        uVar15 = 0;
        do {
          uVar15 = (uVar15 + local_4f8[lVar8 + 1]) * 2;
          local_4b8[lVar8 + 2] = uVar15;
          lVar8 = lVar8 + 1;
        } while ((ulong)(max_codeword_len + 1) - 2 != lVar8);
      }
    }
    if (num_syms != 0) {
      uVar10 = 0;
      do {
        bVar2 = lens[uVar10];
        uVar15 = local_4b8[bVar2];
        uVar3 = ""[uVar15 & 0xff];
        uVar4 = ""[uVar15 >> 8];
        local_4b8[bVar2] = uVar15 + 1;
        codewords[uVar10] = (uint)(ushort)(CONCAT11(uVar3,uVar4) >> (0x10 - bVar2 & 0x1f));
        uVar10 = uVar10 + 1;
      } while (uVar19 != uVar10);
    }
  }
  return;
}

Assistant:

static void
deflate_make_huffman_code(unsigned num_syms, unsigned max_codeword_len,
			  const u32 freqs[], u8 lens[], u32 codewords[])
{
	u32 *A = codewords;
	unsigned num_used_syms;

	STATIC_ASSERT(DEFLATE_MAX_NUM_SYMS <= 1 << NUM_SYMBOL_BITS);
	STATIC_ASSERT(MAX_BLOCK_LENGTH <= ((u32)1 << NUM_FREQ_BITS) - 1);

	/*
	 * We begin by sorting the symbols primarily by frequency and
	 * secondarily by symbol value.  As an optimization, the array used for
	 * this purpose ('A') shares storage with the space in which we will
	 * eventually return the codewords.
	 */
	num_used_syms = sort_symbols(num_syms, freqs, lens, A);
	/*
	 * 'num_used_syms' is the number of symbols with nonzero frequency.
	 * This may be less than @num_syms.  'num_used_syms' is also the number
	 * of entries in 'A' that are valid.  Each entry consists of a distinct
	 * symbol and a nonzero frequency packed into a 32-bit integer.
	 */

	/*
	 * A complete Huffman code must contain at least 2 codewords.  Yet, it's
	 * possible that fewer than 2 symbols were used.  When this happens,
	 * it's usually for the offset code (0-1 symbols used).  But it's also
	 * theoretically possible for the litlen and pre codes (1 symbol used).
	 *
	 * The DEFLATE RFC explicitly allows the offset code to contain just 1
	 * codeword, or even be completely empty.  But it's silent about the
	 * other codes.  It also doesn't say whether, in the 1-codeword case,
	 * the codeword (which it says must be 1 bit) is '0' or '1'.
	 *
	 * In any case, some DEFLATE decompressors reject these cases.  zlib
	 * generally allows them, but it does reject precodes that have just 1
	 * codeword.  More problematically, zlib v1.2.1 and earlier rejected
	 * empty offset codes, and this behavior can also be seen in Windows
	 * Explorer's ZIP unpacker (supposedly even still in Windows 11).
	 *
	 * Other DEFLATE compressors, including zlib, always send at least 2
	 * codewords in order to make a complete Huffman code.  Therefore, this
	 * is a case where practice does not entirely match the specification.
	 * We follow practice by generating 2 codewords of length 1: codeword
	 * '0' for symbol 0, and codeword '1' for another symbol -- the used
	 * symbol if it exists and is not symbol 0, otherwise symbol 1.  This
	 * does worsen the compression ratio by having to send an unnecessary
	 * offset codeword length.  But this only affects rare cases such as
	 * blocks containing all literals, and it only makes a tiny difference.
	 */
	if (unlikely(num_used_syms < 2)) {
		unsigned sym = num_used_syms ? (A[0] & SYMBOL_MASK) : 0;
		unsigned nonzero_idx = sym ? sym : 1;

		codewords[0] = 0;
		lens[0] = 1;
		codewords[nonzero_idx] = 1;
		lens[nonzero_idx] = 1;
		return;
	}

	/*
	 * Build a stripped-down version of the Huffman tree, sharing the array
	 * 'A' with the symbol values.  Then extract length counts from the tree
	 * and use them to generate the final codewords.
	 */

	build_tree(A, num_used_syms);

	{
		unsigned len_counts[DEFLATE_MAX_CODEWORD_LEN + 1];

		compute_length_counts(A, num_used_syms - 2,
				      len_counts, max_codeword_len);

		gen_codewords(A, lens, len_counts, max_codeword_len, num_syms);
	}
}